

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrunnable.h
# Opt level: O2

void * QRunnable::QGenericRunnable::Helper<std::function<void_()>_>::impl
                 (Op op,HelperBase *that,void *arg)

{
  if (op == Destroy) {
    if (that != (HelperBase *)0x0) {
      std::_Function_base::~_Function_base((_Function_base *)(that + 1));
    }
    operator_delete(that,0x28);
  }
  else if (op == Run) {
    std::function<void_()>::operator()((function<void_()> *)(that + 1));
  }
  return (void *)0x0;
}

Assistant:

static void *impl(Op op, HelperBase *that, [[maybe_unused]] void *arg)
        {
            const auto _this = static_cast<Helper*>(that);
            switch (op) {
            case Op::Run:     _this->object()(); break;
            case Op::Destroy: delete _this; break;
            }
            return nullptr;
        }